

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schriter.cpp
# Opt level: O1

void __thiscall
icu_63::StringCharacterIterator::setText(StringCharacterIterator *this,UnicodeString *newText)

{
  ushort uVar1;
  int32_t newTextLength;
  ConstChar16Ptr local_20 [3];
  
  UnicodeString::operator=(&this->text,newText);
  uVar1 = (this->text).fUnion.fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      local_20[0].p_ = (this->text).fUnion.fFields.fArray;
    }
    else {
      local_20[0].p_ = (char16_t *)((long)&(this->text).fUnion + 2);
    }
  }
  else {
    local_20[0].p_ = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    newTextLength = (this->text).fUnion.fFields.fLength;
  }
  else {
    newTextLength = (int)(short)uVar1 >> 5;
  }
  UCharCharacterIterator::setText(&this->super_UCharCharacterIterator,local_20,newTextLength);
  return;
}

Assistant:

void
StringCharacterIterator::setText(const UnicodeString& newText) {
    text = newText;
    UCharCharacterIterator::setText(text.getBuffer(), text.length());
}